

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakDetector::deallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,char *file,
          size_t line,bool allocatNodesSeperately)

{
  MemoryLeakFailure *reporter;
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  TestMemoryAllocator *allocAllocator;
  MemoryLeakDetectorNode *pMVar4;
  MemoryLeakDetectorNode *pMVar5;
  MemoryLeakDetectorNode *node;
  
  if (memory != (void *)0x0) {
    uVar3 = (int)memory + (int)((ulong)memory / 0x49) * -0x49;
    node = (this->memoryTable_).table_[uVar3].head_;
    if (node == (MemoryLeakDetectorNode *)0x0) {
LAB_00140ca6:
      reporter = this->reporter_;
      allocAllocator = NullUnknownAllocator::defaultAllocator();
      MemoryLeakOutputStringBuffer::reportFailure
                (&this->outputBuffer_,"Deallocating non-allocated memory\n","<unknown>",0,0,
                 allocAllocator,file,line,allocator,reporter);
    }
    else {
      if (*(void **)(node + 0x10) == memory) {
        pMVar4 = (MemoryLeakDetectorNode *)0x0;
      }
      else {
        do {
          pMVar4 = node;
          node = *(MemoryLeakDetectorNode **)(pMVar4 + 0x38);
          if (node == (MemoryLeakDetectorNode *)0x0) goto LAB_00140ca6;
        } while (*(void **)(node + 0x10) != memory);
      }
      pMVar5 = pMVar4 + 0x38;
      if (pMVar4 == (MemoryLeakDetectorNode *)0x0) {
        pMVar5 = (MemoryLeakDetectorNode *)((this->memoryTable_).table_ + uVar3);
      }
      *(undefined8 *)pMVar5 = *(undefined8 *)(node + 0x38);
      bVar2 = TestMemoryAllocator::hasBeenDestroyed(allocator);
      if (!bVar2) {
        uVar1 = *(undefined8 *)node;
        checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
        (*allocator->_vptr_TestMemoryAllocator[3])(allocator,memory,uVar1,file,line);
        return;
      }
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocMemory(TestMemoryAllocator* allocator, void* memory, const char* file, size_t line, bool allocatNodesSeperately)
{
    if (memory == NULLPTR) return;

    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (node == NULLPTR) {
        outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
        return;
    }
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (!allocator->hasBeenDestroyed()) {
        size_t size = node->size_;
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
        allocator->free_memory((char*) memory, size, file, line);
    }
}